

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O2

int Bmc_PerformISearchOne
              (Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fVerbose,
              Vec_Int_t *vLits)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint i;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Gia_Man_t *p1;
  Gia_Man_t *pGia;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  Vec_Int_t *vRegs;
  ulong uVar8;
  abctime aVar9;
  ulong uVar10;
  abctime time;
  int iVar11;
  char *pStr;
  uint uVar12;
  int local_6c;
  
  pStr = (char *)(ulong)(uint)nFramesMax;
  aVar7 = Abc_Clock();
  if (nFramesMax < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x17d,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x17e,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  p1 = Gia_ManDup(p);
  iVar11 = 1;
  iVar3 = 0;
  pGia = Gia_ManMiter(p,p1,0,1,1,0,0);
  Gia_ManStop(p1);
  if (pGia->vCos->nSize - pGia->nRegs != (p->vCos->nSize - p->nRegs) * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x184,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  if (pGia->nRegs != p->nRegs * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x185,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  pCnf = Mf_ManGenerateCnf(pGia,8,0,0,0);
  s = Bmc_DeriveSolver(p,pGia,pCnf,nFramesMax,nTimeOut,iVar3);
  iVar3 = sat_solver_solve(s,vLits->pArray,vLits->pArray + vLits->nSize,0,0,0,0);
  if (iVar3 == 1) {
    printf("I = %4d :  ",(ulong)(uint)nFramesMax);
    puts("Problem is satisfiable.");
    sat_solver_delete(s);
    Cnf_DataFree(pCnf);
    Gia_ManStop(pGia);
    iVar11 = 1;
  }
  else {
    if (iVar3 == 0) {
      vRegs = (Vec_Int_t *)0x0;
      printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
             ,(ulong)(uint)nTimeOut);
    }
    else {
      if (iVar3 != -1) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                      ,0x1a9,
                      "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                     );
      }
      local_6c = 0;
      for (iVar11 = 0; uVar4 = p->nRegs, iVar11 < (int)uVar4; iVar11 = iVar11 + 1) {
        iVar3 = Vec_IntEntry(vLits,iVar11);
        uVar4 = Abc_LitIsCompl(iVar3);
        local_6c = local_6c + (uVar4 ^ 1);
      }
      vRegs = Vec_IntAlloc(uVar4);
      vRegs->nSize = uVar4;
      uVar8 = 0;
      uVar10 = 0;
      if (0 < (int)uVar4) {
        uVar10 = (ulong)uVar4;
      }
      for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        vRegs->pArray[uVar8] = (int)uVar8;
      }
      if (fBackTopo != 0) {
        Bmc_PerformFindFlopOrder(p,vRegs);
        uVar4 = vRegs->nSize;
      }
      if (fReverse != 0) {
        uVar8 = (long)(int)uVar4 / 2 & 0xffffffff;
        uVar10 = 0;
        uVar12 = uVar4;
        if ((int)((long)(int)uVar4 / 2) < 1) {
          uVar8 = 0;
        }
        for (; uVar12 = uVar12 - 1, uVar8 != uVar10; uVar10 = uVar10 + 1) {
          piVar2 = vRegs->pArray;
          iVar11 = piVar2[uVar10];
          piVar2[uVar10] = piVar2[(int)uVar12];
          piVar2[(int)uVar12] = iVar11;
        }
      }
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
        i = Vec_IntEntry(vRegs,uVar12);
        iVar11 = Vec_IntEntry(vLits,i);
        iVar11 = Abc_LitIsCompl(iVar11);
        if (iVar11 == 0) {
          iVar11 = Vec_IntEntry(vLits,i);
          iVar11 = Abc_LitNot(iVar11);
          Vec_IntWriteEntry(vLits,i,iVar11);
          iVar11 = sat_solver_solve(s,vLits->pArray,vLits->pArray + vLits->nSize,0,0,0,0);
          if (iVar11 == -1) {
            local_6c = local_6c + -1;
          }
          else {
            if (iVar11 != 1) {
              if (iVar11 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                              ,0x1c9,
                              "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                             );
              }
              printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
                     ,(ulong)(uint)nTimeOut);
              iVar11 = 1;
              goto LAB_00452559;
            }
            iVar11 = Vec_IntEntry(vLits,i);
            iVar11 = Abc_LitNot(iVar11);
            Vec_IntWriteEntry(vLits,i,iVar11);
          }
          if (fVerbose != 0) {
            iVar11 = Gia_ManAndNum(pGia);
            sat_solver_nvars(s);
            sat_solver_nconflicts(s);
            iVar3 = 0x779d3f;
            printf("I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                   ((double)local_6c * 100.0) / (double)p->nRegs,(ulong)i,
                   (ulong)(uint)(iVar11 * (nFramesMax + 1)));
            Abc_Print(iVar3,"%s =","Time");
            aVar9 = Abc_Clock();
            Abc_Print(iVar3,"%9.2f sec\r",(double)(aVar9 - aVar7) / 1000000.0);
            fflush(_stdout);
          }
        }
      }
      iVar11 = 0;
      if (fVerbose != 0) {
        iVar5 = Gia_ManAndNum(pGia);
        iVar3 = p->vCos->nSize;
        iVar1 = p->nRegs;
        iVar6 = sat_solver_nvars(s);
        uVar4 = sat_solver_nconflicts(s);
        printf("M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
               ((double)local_6c * 100.0) / (double)p->nRegs,pStr,
               (ulong)(uint)((nFramesMax + 1) * iVar5),(ulong)(uint)(iVar3 + iVar1 + iVar6),
               (ulong)uVar4);
        aVar9 = Abc_Clock();
        Abc_PrintTime((int)aVar9 - (int)aVar7,pStr,time);
        fflush(_stdout);
      }
    }
LAB_00452559:
    sat_solver_delete(s);
    Cnf_DataFree(pCnf);
    Gia_ManStop(pGia);
    Vec_IntFree(vRegs);
  }
  return iVar11;
}

Assistant:

int Bmc_PerformISearchOne( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fVerbose, Vec_Int_t * vLits )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vRegs = NULL;
//    Vec_Int_t * vLits;
    int i, Iter, status;
    int nLitsUsed, RetValue = 0;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
        //pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        //Gia_ManStop( pTemp );
        //pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
        pCnf = Mf_ManGenerateCnf( pMiter, 8, 0, 0, 0 );
    }
/*
    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
*/
    // derive SAT solver        
    pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_True )
    {
        printf( "I = %4d :  ", nFramesMax );
        printf( "Problem is satisfiable.\n" );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        Gia_ManStop( pMiter );
        return 1;
    }
    if ( status == l_Undef )
    {
        printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
        RetValue = 1;
        goto cleanup;
    }
    assert( status == l_False );

    // count the number of positive literals
    nLitsUsed = 0;
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            nLitsUsed++;

    // try removing variables
    vRegs = Vec_IntStartNatural( Gia_ManRegNum(p) );
    if ( fBackTopo )
        Bmc_PerformFindFlopOrder( p, vRegs );
    if ( fReverse )
        Vec_IntReverseOrder( vRegs );
//    for ( Iter = 0; Iter < Gia_ManRegNum(p); Iter++ )
    Vec_IntForEachEntry( vRegs, i, Iter )
    {
//        i = fReverse ? Gia_ManRegNum(p) - 1 - Iter : Iter;
        if ( Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            continue;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
            RetValue = 1;
            goto cleanup;
        }
        if ( status == l_True )
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        else if ( status == l_False )
            nLitsUsed--;
        else assert( 0 );
        // report the results
        //printf( "Round %d:  ", o );
        if ( fVerbose )
        {
            printf( "I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                i, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
                Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
                sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
            ABC_PRTr( "Time", Abc_Clock() - clkStart );
            fflush( stdout );
        }
    }
    // report the results
    //printf( "Round %d:  ", o );
    if ( fVerbose )
    {
        printf( "M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        fflush( stdout );
    }
cleanup:
    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vRegs );
//    Vec_IntFree( vLits );
    return RetValue;
}